

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

void Service_ActivateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_Session *session,
               UA_ActivateSessionRequest *request,UA_ActivateSessionResponse *response)

{
  long lVar1;
  UA_SecureChannel *pUVar2;
  UA_DataType *pUVar3;
  long *plVar4;
  char *pcVar5;
  size_t __n;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  UA_Byte **ppUVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 local_70 [8];
  timespec ts;
  
  lVar1 = session->validTill;
  clock_gettime(4,(timespec *)local_70);
  if (lVar1 < ts.tv_sec / 100 + (long)local_70 * 10000000) {
    pUVar2 = session->channel;
    if (pUVar2 == (UA_SecureChannel *)0x0) {
      uVar7 = 0;
      uVar8 = 0;
    }
    else {
      if (pUVar2->connection == (UA_Connection *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(uint)pUVar2->connection->sockfd;
      }
      uVar8 = (ulong)(pUVar2->securityToken).channelId;
    }
    ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[0];
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the session has timed out"
                ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,ts.tv_nsec,
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],
                (ulong)(channel->securityToken).channelId);
    (response->responseHeader).serviceResult = 0x80250000;
  }
  else {
    if (((request->userIdentityToken).encoding < UA_EXTENSIONOBJECT_DECODED) ||
       (pUVar3 = (request->userIdentityToken).content.decoded.type,
       pUVar3 != (UA_DataType *)0x13f2b0 && pUVar3 != (UA_DataType *)0x13ec20)) {
      pUVar2 = session->channel;
      if (pUVar2 == (UA_SecureChannel *)0x0) {
        uVar7 = 0;
        uVar8 = 0;
      }
      else {
        if (pUVar2->connection == (UA_Connection *)0x0) {
          uVar7 = 0;
        }
        else {
          uVar7 = (ulong)(uint)pUVar2->connection->sockfd;
        }
        uVar8 = (ulong)(pUVar2->securityToken).channelId;
      }
      ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[0];
      UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the UserIdentify token is invalid"
                  ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                  (ulong)(session->sessionId).identifier.guid.data2,
                  (ulong)(session->sessionId).identifier.guid.data3,ts.tv_nsec,
                  (ulong)(session->sessionId).identifier.guid.data4[1],
                  (ulong)(session->sessionId).identifier.guid.data4[2],
                  (ulong)(session->sessionId).identifier.guid.data4[3],
                  (ulong)(session->sessionId).identifier.guid.data4[4],
                  (ulong)(session->sessionId).identifier.guid.data4[5],
                  (ulong)(session->sessionId).identifier.guid.data4[6],
                  (ulong)(session->sessionId).identifier.guid.data4[7],
                  (ulong)(channel->securityToken).channelId);
    }
    else if ((pUVar3 == (UA_DataType *)0x13ec20) && ((server->config).enableAnonymousLogin != false)
            ) {
      plVar4 = (long *)(request->userIdentityToken).content.decoded.data;
      pcVar5 = (char *)plVar4[1];
      if ((pcVar5 == (char *)0x0) ||
         ((*plVar4 == 0x1a &&
          (auVar13[0] = -(pcVar5[10] == 'a'), auVar13[1] = -(pcVar5[0xb] == 'n'),
          auVar13[2] = -(pcVar5[0xc] == 'o'), auVar13[3] = -(pcVar5[0xd] == 'n'),
          auVar13[4] = -(pcVar5[0xe] == 'y'), auVar13[5] = -(pcVar5[0xf] == 'm'),
          auVar13[6] = -(pcVar5[0x10] == 'o'), auVar13[7] = -(pcVar5[0x11] == 'u'),
          auVar13[8] = -(pcVar5[0x12] == 's'), auVar13[9] = -(pcVar5[0x13] == '-'),
          auVar13[10] = -(pcVar5[0x14] == 'p'), auVar13[0xb] = -(pcVar5[0x15] == 'o'),
          auVar13[0xc] = -(pcVar5[0x16] == 'l'), auVar13[0xd] = -(pcVar5[0x17] == 'i'),
          auVar13[0xe] = -(pcVar5[0x18] == 'c'), auVar13[0xf] = -(pcVar5[0x19] == 'y'),
          auVar11[0] = -(*pcVar5 == 'o'), auVar11[1] = -(pcVar5[1] == 'p'),
          auVar11[2] = -(pcVar5[2] == 'e'), auVar11[3] = -(pcVar5[3] == 'n'),
          auVar11[4] = -(pcVar5[4] == '6'), auVar11[5] = -(pcVar5[5] == '2'),
          auVar11[6] = -(pcVar5[6] == '5'), auVar11[7] = -(pcVar5[7] == '4'),
          auVar11[8] = -(pcVar5[8] == '1'), auVar11[9] = -(pcVar5[9] == '-'),
          auVar11[10] = -(pcVar5[10] == 'a'), auVar11[0xb] = -(pcVar5[0xb] == 'n'),
          auVar11[0xc] = -(pcVar5[0xc] == 'o'), auVar11[0xd] = -(pcVar5[0xd] == 'n'),
          auVar11[0xe] = -(pcVar5[0xe] == 'y'), auVar11[0xf] = -(pcVar5[0xf] == 'm'),
          auVar11 = auVar11 & auVar13,
          (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff)))) {
LAB_0011ddf5:
        pUVar2 = session->channel;
        if (pUVar2 != channel && pUVar2 != (UA_SecureChannel *)0x0) {
          if (pUVar2->connection == (UA_Connection *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(uint)pUVar2->connection->sockfd;
          }
          ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[1];
          UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                      "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Detach from old channel"
                      ,uVar7,(ulong)(pUVar2->securityToken).channelId,
                      (ulong)(session->sessionId).identifier.numeric,
                      (ulong)(session->sessionId).identifier.guid.data2,
                      (ulong)(session->sessionId).identifier.guid.data3,
                      (ulong)(session->sessionId).identifier.guid.data4[0],ts.tv_nsec,
                      (ulong)(session->sessionId).identifier.guid.data4[2],
                      (ulong)(session->sessionId).identifier.guid.data4[3],
                      (ulong)(session->sessionId).identifier.guid.data4[4],
                      (ulong)(session->sessionId).identifier.guid.data4[5],
                      (ulong)(session->sessionId).identifier.guid.data4[6],
                      (ulong)(session->sessionId).identifier.guid.data4[7]);
          UA_SecureChannel_detachSession(session->channel,session);
        }
        UA_SecureChannel_attachSession(channel,session);
        session->activated = true;
        UA_Session_updateLifetime(session);
        pUVar2 = session->channel;
        if (pUVar2 == (UA_SecureChannel *)0x0) {
          uVar7 = 0;
          uVar8 = 0;
        }
        else {
          if (pUVar2->connection == (UA_Connection *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(uint)pUVar2->connection->sockfd;
          }
          uVar8 = (ulong)(pUVar2->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Session activated"
                    ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        return;
      }
    }
    else if (((pUVar3 == (UA_DataType *)0x13f2b0 & (server->config).enableUsernamePasswordLogin) ==
              1) && (plVar4 = (long *)(request->userIdentityToken).content.decoded.data,
                    *plVar4 == 0x19)) {
      pcVar5 = (char *)plVar4[1];
      auVar14[0] = -(pcVar5[9] == '-');
      auVar14[1] = -(pcVar5[10] == 'u');
      auVar14[2] = -(pcVar5[0xb] == 's');
      auVar14[3] = -(pcVar5[0xc] == 'e');
      auVar14[4] = -(pcVar5[0xd] == 'r');
      auVar14[5] = -(pcVar5[0xe] == 'n');
      auVar14[6] = -(pcVar5[0xf] == 'a');
      auVar14[7] = -(pcVar5[0x10] == 'm');
      auVar14[8] = -(pcVar5[0x11] == 'e');
      auVar14[9] = -(pcVar5[0x12] == '-');
      auVar14[10] = -(pcVar5[0x13] == 'p');
      auVar14[0xb] = -(pcVar5[0x14] == 'o');
      auVar14[0xc] = -(pcVar5[0x15] == 'l');
      auVar14[0xd] = -(pcVar5[0x16] == 'i');
      auVar14[0xe] = -(pcVar5[0x17] == 'c');
      auVar14[0xf] = -(pcVar5[0x18] == 'y');
      auVar12[0] = -(*pcVar5 == 'o');
      auVar12[1] = -(pcVar5[1] == 'p');
      auVar12[2] = -(pcVar5[2] == 'e');
      auVar12[3] = -(pcVar5[3] == 'n');
      auVar12[4] = -(pcVar5[4] == '6');
      auVar12[5] = -(pcVar5[5] == '2');
      auVar12[6] = -(pcVar5[6] == '5');
      auVar12[7] = -(pcVar5[7] == '4');
      auVar12[8] = -(pcVar5[8] == '1');
      auVar12[9] = -(pcVar5[9] == '-');
      auVar12[10] = -(pcVar5[10] == 'u');
      auVar12[0xb] = -(pcVar5[0xb] == 's');
      auVar12[0xc] = -(pcVar5[0xc] == 'e');
      auVar12[0xd] = -(pcVar5[0xd] == 'r');
      auVar12[0xe] = -(pcVar5[0xe] == 'n');
      auVar12[0xf] = -(pcVar5[0xf] == 'a');
      auVar12 = auVar12 & auVar14;
      if ((((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff) && (plVar4[6] == 0)) &&
         ((__n = plVar4[2], __n != 0 || (plVar4[4] != 0)))) {
        sVar9 = (server->config).usernamePasswordLoginsSize;
        if (sVar9 != 0) {
          ppUVar10 = &(((server->config).usernamePasswordLogins)->password).data;
          do {
            if (((((UA_Byte *)__n == ppUVar10[-3]) &&
                 (iVar6 = bcmp((void *)plVar4[3],ppUVar10[-2],__n), iVar6 == 0)) &&
                (plVar4[4] == ((UA_String *)(ppUVar10 + -1))->length)) &&
               (iVar6 = bcmp((void *)plVar4[5],*ppUVar10,plVar4[4]), iVar6 == 0)) goto LAB_0011ddf5;
            ppUVar10 = ppUVar10 + 4;
            sVar9 = sVar9 - 1;
          } while (sVar9 != 0);
        }
        pUVar2 = session->channel;
        if (pUVar2 == (UA_SecureChannel *)0x0) {
          uVar7 = 0;
          uVar8 = 0;
        }
        else {
          if (pUVar2->connection == (UA_Connection *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)(uint)pUVar2->connection->sockfd;
          }
          uVar8 = (ulong)(pUVar2->securityToken).channelId;
        }
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Did not find matching username/password"
                    ,uVar7,uVar8,(ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],
                    (ulong)(session->sessionId).identifier.guid.data4[1],
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        (response->responseHeader).serviceResult = 0x801f0000;
        return;
      }
    }
    (response->responseHeader).serviceResult = 0x80200000;
  }
  return;
}

Assistant:

void
Service_ActivateSession(UA_Server *server, UA_SecureChannel *channel,
                        UA_Session *session, const UA_ActivateSessionRequest *request,
                        UA_ActivateSessionResponse *response) {
    if(session->validTill < UA_DateTime_nowMonotonic()) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the session has timed out", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSESSIONIDINVALID;
        return;
    }

    if(request->userIdentityToken.encoding < UA_EXTENSIONOBJECT_DECODED ||
       (request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN] &&
        request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN])) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the UserIdentify token is invalid", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }


    UA_String ap = UA_STRING(ANONYMOUS_POLICY);
    UA_String up = UA_STRING(USERNAME_POLICY);

    /* Compatibility notice: Siemens OPC Scout v10 provides an empty policyId,
       this is not okay For compatibility we will assume that empty policyId == ANONYMOUS_POLICY
       if(token.policyId->data == NULL)
           response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
    */

    if(server->config.enableAnonymousLogin &&
       request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN]) {
        /* anonymous login */
        const UA_AnonymousIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(token->policyId.data && !UA_String_equal(&token->policyId, &ap)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
    } else if(server->config.enableUsernamePasswordLogin &&
              request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN]) {
        /* username login */
        const UA_UserNameIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(!UA_String_equal(&token->policyId, &up)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
        if(token->encryptionAlgorithm.length > 0) {
            /* we don't support encryption */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        if(token->userName.length == 0 && token->password.length == 0) {
            /* empty username and password */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        /* trying to match pw/username */
        UA_Boolean match = false;
        for(size_t i = 0; i < server->config.usernamePasswordLoginsSize; ++i) {
            UA_String *user = &server->config.usernamePasswordLogins[i].username;
            UA_String *pw = &server->config.usernamePasswordLogins[i].password;
            if(UA_String_equal(&token->userName, user) && UA_String_equal(&token->password, pw)) {
                match = true;
                break;
            }
        }
        if(!match) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "ActivateSession: Did not find matching username/password");
            response->responseHeader.serviceResult = UA_STATUSCODE_BADUSERACCESSDENIED;
            return;
        }
    } else {
        /* Unsupported token type */
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }

    /* Detach the old SecureChannel */
    if(session->channel && session->channel != channel) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Detach from old channel");
        UA_SecureChannel_detachSession(session->channel, session);
    }

    /* Attach to the SecureChannel and activate */
    UA_SecureChannel_attachSession(channel, session);
    session->activated = true;
    UA_Session_updateLifetime(session);
    UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Session activated");
}